

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket_legacy::test_method
          (caddrinfo_get_tried_bucket_legacy *this)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar10;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  int local_544;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  direct_or_indirect local_430;
  uint local_420;
  undefined1 *local_418;
  uint16_t local_410;
  undefined1 local_408 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  direct_or_indirect local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  string local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  direct_or_indirect local_368;
  uint local_358;
  char *local_350;
  uint16_t local_348;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count sStack_330;
  char *local_328;
  uint16_t local_320;
  NodeSeconds local_318;
  ServiceFlags local_310;
  direct_or_indirect local_308;
  shared_count sStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  direct_or_indirect local_2c0;
  uint local_2b0;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  undefined1 local_258 [16];
  undefined8 local_248;
  string *psStack_240;
  uchar local_238 [8];
  NodeSeconds NStack_230;
  ServiceFlags local_228;
  NodeSeconds NStack_220;
  NodeSeconds local_218;
  direct_or_indirect dStack_210;
  undefined8 uStack_200;
  uint64_t local_1f8;
  uint256 nKey2;
  uint256 nKey1;
  direct_or_indirect local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [3];
  void *local_150;
  uint local_140;
  direct_or_indirect local_118;
  uint local_108;
  direct_or_indirect local_f8;
  uint local_e8;
  undefined8 local_e0;
  undefined2 local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  undefined8 local_b8;
  undefined2 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.1.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&local_198.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = local_80;
  local_50 = local_78;
  local_48 = 100000000;
  local_40 = 0;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.1.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_198.indirect_contents,9999
                );
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_b8 = local_e0;
  local_b0 = local_d8;
  local_a8 = 100000000;
  local_a0 = 0;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.1.1","");
  ResolveIP((CNetAddr *)&local_118.indirect_contents,(string *)&local_198.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  AddrInfo::AddrInfo((AddrInfo *)&local_198.indirect_contents,
                     (CAddress *)&local_70.indirect_contents,
                     (CNetAddr *)&local_118.indirect_contents);
  dStack_210.direct[8] = '\0';
  dStack_210.direct[9] = '\0';
  dStack_210.direct[10] = '\0';
  dStack_210.direct[0xb] = '\0';
  dStack_210.direct[0xc] = '\0';
  dStack_210.direct[0xd] = '\0';
  dStack_210.direct[0xe] = '\0';
  dStack_210.direct[0xf] = '\0';
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218.__d.__r = (duration)0;
  dStack_210.indirect_contents.indirect = (char *)0x0;
  local_228 = NODE_NONE;
  NStack_220.__d.__r = (duration)0;
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  NStack_230.__d.__r = (duration)0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  psStack_240 = (string *)0x0;
  local_258._0_8_ = (_func_int **)0x0;
  local_258._8_8_ = 0;
  local_1f8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_258);
  local_308._0_4_ = 1;
  CSHA256::Write((CSHA256 *)local_258,(uchar *)local_308.direct,4);
  HashWriter::GetHash(&nKey1,(HashWriter *)local_258);
  dStack_210.direct[8] = '\0';
  dStack_210.direct[9] = '\0';
  dStack_210.direct[10] = '\0';
  dStack_210.direct[0xb] = '\0';
  dStack_210.direct[0xc] = '\0';
  dStack_210.direct[0xd] = '\0';
  dStack_210.direct[0xe] = '\0';
  dStack_210.direct[0xf] = '\0';
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218.__d.__r = (duration)0;
  dStack_210.indirect_contents.indirect = (char *)0x0;
  local_228 = NODE_NONE;
  NStack_220.__d.__r = (duration)0;
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  NStack_230.__d.__r = (duration)0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  psStack_240 = (string *)0x0;
  local_258._0_8_ = (_func_int **)0x0;
  local_258._8_8_ = 0;
  local_1f8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_258);
  local_308._0_4_ = 2;
  CSHA256::Write((CSHA256 *)local_258,(uchar *)local_308.direct,4);
  HashWriter::GetHash(&nKey2,(HashWriter *)local_258);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1d6;
  file.m_begin = (iterator)&local_480;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_490,msg);
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_01388f08;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_3e8._M_allocated_capacity._0_4_ =
       AddrInfo::GetTriedBucket((AddrInfo *)&local_198.indirect_contents,&nKey1,&EMPTY_NETGROUPMAN);
  local_3a8._M_dataplus._M_p = (pointer)&local_3e8;
  local_3c8.indirect_contents.indirect = local_408;
  buckets._M_t._M_impl._0_1_ = local_3e8._M_allocated_capacity._0_4_ == 0x28;
  local_408._0_4_ = 0x28;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._8_8_ = "";
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013890c8;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_3c8;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013890c8;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  psStack_240 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&buckets,(lazy_ostream *)&bucket,1,2,REQUIRE,0xe3182e,
             (size_t)local_388,0x1d6,(HashWriter *)local_258,"40",&local_308);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1da;
  file_00.m_begin = (iterator)&local_4a0;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4b0,
             msg_00);
  iVar2 = AddrInfo::GetTriedBucket
                    ((AddrInfo *)&local_198.indirect_contents,&nKey1,&EMPTY_NETGROUPMAN);
  _cVar10 = 0x234b08;
  iVar3 = AddrInfo::GetTriedBucket
                    ((AddrInfo *)&local_198.indirect_contents,&nKey2,&EMPTY_NETGROUPMAN);
  local_308.direct[0] = iVar2 != iVar3;
  local_308._8_8_ = (element_type *)0x0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  _bucket = (undefined **)0xe3185d;
  local_338 = (long)
              "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN)"
              + 0x60;
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_01389048;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  psStack_240 = (string *)&bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_308,(lazy_ostream *)local_258,1,0,WARN,_cVar10,
             (size_t)&local_4c0,0x1da);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  AddrInfo::AddrInfo((AddrInfo *)local_258,(CAddress *)&local_d0.indirect_contents,
                     (CNetAddr *)&local_118.indirect_contents);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1e0;
  file_01.m_begin = (iterator)&local_4d0;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4e0,
             msg_01);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&local_198.indirect_contents);
  _cVar10 = 0x234c28;
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
                   (CService *)local_258);
  bVar9 = true;
  if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - buckets._M_t._M_impl._0_8_ ==
      local_388._8_8_ - local_388._0_8_) {
    if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == buckets._M_t._M_impl._0_8_) {
      bVar9 = false;
    }
    else {
      _cVar10 = 0x234c62;
      iVar2 = bcmp((void *)buckets._M_t._M_impl._0_8_,(void *)local_388._0_8_,
                   buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                   buckets._M_t._M_impl._0_8_);
      bVar9 = iVar2 != 0;
    }
  }
  bucket._0_1_ = bVar9;
  local_338 = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_3a8._M_dataplus._M_p = "info1.GetKey() != info2.GetKey()";
  local_3a8._M_string_length = 0xe318de;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_3a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&local_308,1,0,WARN,_cVar10,
             (size_t)&local_4f0,0x1e0);
  boost::detail::shared_count::~shared_count(&sStack_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_388._0_8_,local_378._M_allocated_capacity - local_388._0_8_);
  }
  if (buckets._M_t._M_impl._0_8_ != 0) {
    operator_delete((void *)buckets._M_t._M_impl._0_8_,
                    (long)buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                    buckets._M_t._M_impl._0_8_);
  }
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1e1;
  file_02.m_begin = (iterator)&local_500;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_510,
             msg_02);
  iVar2 = AddrInfo::GetTriedBucket
                    ((AddrInfo *)&local_198.indirect_contents,&nKey1,&EMPTY_NETGROUPMAN);
  _cVar10 = 0x234da9;
  iVar3 = AddrInfo::GetTriedBucket((AddrInfo *)local_258,&nKey1,&EMPTY_NETGROUPMAN);
  bucket._0_1_ = iVar2 != iVar3;
  local_338 = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  buckets._M_t._M_impl._0_8_ = anon_var_dwarf_1a166b;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)
       "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN)"
       + 0x60;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  pvVar7 = (iterator)0x0;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&buckets;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&local_308,1,0,WARN,_cVar10,
             (size_t)&local_520,0x1e1);
  boost::detail::shared_count::~shared_count(&sStack_330);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450._M_dataplus._M_p = (pointer)((ulong)local_450._M_dataplus._M_p._4_4_ << 0x20);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    util::ToString<int>(&local_3a8,(int *)&local_450);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_3a8,0,0,"250.1.1.",8);
    local_388._0_8_ = &local_378;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_378._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_378._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_378._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_388._0_8_ = paVar6;
    }
    local_388._8_8_ = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_368.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368.indirect_contents);
    local_328 = local_350;
    local_320 = local_348;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>((string *)local_408,(int *)&local_450);
    pvVar8 = &DAT_00000008;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_408,0,0,"250.1.1.",8);
    local_3e8._M_allocated_capacity = (size_type)(pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity == paVar6) {
      local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_3d8._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_3e8._M_allocated_capacity = (size_type)&local_3d8;
    }
    else {
      local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_3e8._8_8_ = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3c8,(string *)&local_3e8);
    AddrInfo::AddrInfo((AddrInfo *)&local_308,(CAddress *)&bucket,(CNetAddr *)&local_3c8);
    if (0x10 < (uint)local_3b8._M_allocated_capacity._0_4_) {
      free(local_3c8.indirect_contents.indirect);
      local_3c8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity != &local_3d8) {
      operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_358) {
      free(local_368.indirect_contents.indirect);
      local_368.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &local_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    iVar2 = AddrInfo::GetTriedBucket((AddrInfo *)&local_308,&nKey1,&EMPTY_NETGROUPMAN);
    bucket = iVar2;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < local_2b0) {
      free(local_2c0.indirect_contents.indirect);
      local_2c0.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < (uint)sStack_2f8.pi_) {
      free(local_308.indirect_contents.indirect);
    }
    iVar2 = (int)local_450._M_dataplus._M_p;
    local_450._M_dataplus._M_p._0_4_ = (int)local_450._M_dataplus._M_p + 1;
  } while (iVar2 < 0xfe);
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1ed;
  file_03.m_begin = (iterator)&local_530;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_540,
             msg_03);
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_01388f08;
  local_378._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_378._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450._M_dataplus._M_p = (pointer)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_408._0_8_ = &local_470;
  local_470._M_dataplus._M_p._0_4_ = 8;
  local_3a8._M_dataplus._M_p._0_1_ = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 8;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_3c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_3e8;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_01388f88;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = local_408;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,2,REQUIRE,0xf97a12,
             (size_t)&local_3c8,0x1ed,&local_308,"8U",(CAddress *)&bucket);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  local_544 = 0;
  do {
    util::ToString<int>((string *)&local_3c8,&local_544);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)&local_3c8,0,0,"250.",4);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_3a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_3a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_3a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_3a8._M_dataplus._M_p = (pointer)paVar6;
    }
    local_3a8._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_3a8,".1.1");
    local_388._0_8_ = &local_378;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_378._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_378._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_378._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_388._0_8_ = paVar6;
    }
    local_388._8_8_ = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_430.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_430.indirect_contents);
    local_328 = local_418;
    local_320 = local_410;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>(&local_470,&local_544);
    pvVar8 = (iterator)0x4;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_470,0,0,"250.",4);
    local_450._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p == paVar6) {
      local_450.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_450.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    }
    else {
      local_450.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_450._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_450,".1.1");
    local_408._0_8_ = local_408 + 0x10;
    psVar1 = (string *)(pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if (psVar1 == (string *)paVar6) {
      local_408._16_8_ = paVar6->_M_allocated_capacity;
      local_408._24_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_408._16_8_ = paVar6->_M_allocated_capacity;
      local_408._0_8_ = psVar1;
    }
    local_408._8_8_ = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3e8,(string *)local_408);
    AddrInfo::AddrInfo((AddrInfo *)&local_308,(CAddress *)&bucket,(CNetAddr *)&local_3e8);
    if (0x10 < (uint)local_3d8._M_allocated_capacity._0_4_) {
      free((void *)local_3e8._M_allocated_capacity);
      local_3e8._M_allocated_capacity = 0;
    }
    if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_470._M_dataplus._M_p._4_4_,local_470._M_dataplus._M_p._0_4_) !=
        &local_470.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_470._M_dataplus._M_p._4_4_,local_470._M_dataplus._M_p._0_4_),
                      local_470.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_420) {
      free(local_430.indirect_contents.indirect);
      local_430.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &local_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.indirect_contents.indirect != &local_3b8) {
      operator_delete(local_3c8.indirect_contents.indirect,
                      CONCAT44(local_3b8._M_allocated_capacity._4_4_,
                               local_3b8._M_allocated_capacity._0_4_) + 1);
    }
    iVar2 = AddrInfo::GetTriedBucket((AddrInfo *)&local_308,&nKey1,&EMPTY_NETGROUPMAN);
    bucket = iVar2;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < local_2b0) {
      free(local_2c0.indirect_contents.indirect);
      local_2c0.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < (uint)sStack_2f8.pi_) {
      free(local_308.indirect_contents.indirect);
    }
    iVar2 = local_544 + 1;
    bVar9 = local_544 < 0xfe;
    local_544 = iVar2;
  } while (bVar9);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1f9;
  file_04.m_begin = (iterator)&local_558;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_568,
             msg_04);
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_01388f08;
  local_378._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_378._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450._M_dataplus._M_p = (pointer)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_3a8._M_dataplus._M_p._0_1_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0xa0;
  local_470._M_dataplus._M_p._0_4_ = 0xa0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_3c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_3e8;
  local_408._0_8_ = &local_470;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_01388f88;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = local_408;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,2,REQUIRE,0xf97a12,
             (size_t)&local_3c8,0x1f9,&local_308,"160U",(CAddress *)&bucket);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&buckets._M_t);
  if (0x10 < (size_type)uStack_200) {
    free(dStack_210.indirect_contents.indirect);
    dStack_210.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (size_type)local_248) {
    free((void *)local_258._0_8_);
  }
  if (0x10 < local_140) {
    free(local_150);
    local_150 = (void *)0x0;
  }
  if (0x10 < (uint)local_188[0]._0_4_) {
    free(local_198.indirect_contents.indirect);
  }
  if (0x10 < local_108) {
    free(local_118.indirect_contents.indirect);
  }
  if (0x10 < local_c0) {
    free(local_d0.indirect_contents.indirect);
  }
  if (0x10 < local_60) {
    free(local_70.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket_legacy)
{
    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN), 40);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix should
    // never get more than 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 8U);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix should map to more than
    // 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 160U);
}